

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O2

int CfdParseConfidentialAddress
              (void *handle,char *confidential_address,char **address,char **confidential_key,
              int *network_type)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  CfdException *this;
  char *work_address;
  string local_3f0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3d0;
  ElementsAddressFactory factory;
  Address addr;
  ElementsConfidentialAddress confidential_addr;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(confidential_address);
  if (!bVar1) {
    cfd::ElementsAddressFactory::ElementsAddressFactory(&factory);
    cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&confidential_addr);
    std::__cxx11::string::string((string *)&local_3f0,confidential_address,(allocator *)&local_3d0);
    cfd::ElementsAddressFactory::GetConfidentialAddress
              ((ElementsConfidentialAddress *)&addr,&factory,&local_3f0);
    cfd::core::ElementsConfidentialAddress::operator=
              (&confidential_addr,(ElementsConfidentialAddress *)&addr);
    cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
              ((ElementsConfidentialAddress *)&addr);
    std::__cxx11::string::~string((string *)&local_3f0);
    cfd::core::ElementsConfidentialAddress::GetUnblindedAddress(&addr,&confidential_addr);
    if (network_type != (int *)0x0) {
      iVar2 = cfd::capi::ConvertFromCfdNetType(addr.type_);
      *network_type = iVar2;
    }
    if (address == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::Address::GetAddress_abi_cxx11_(&local_3f0,&addr);
      pcVar3 = cfd::capi::CreateString(&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
    }
    if (confidential_key == (char **)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cfd::core::ElementsConfidentialAddress::GetConfidentialKey
                ((ConfidentialKey *)&local_3d0,&confidential_addr);
      cfd::core::Pubkey::GetHex_abi_cxx11_(&local_3f0,(Pubkey *)&local_3d0);
      pcVar4 = cfd::capi::CreateString(&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3d0);
    }
    if (pcVar3 != (char *)0x0) {
      *address = pcVar3;
    }
    if (pcVar4 != (char *)0x0) {
      *confidential_key = pcVar4;
    }
    cfd::core::Address::~Address(&addr);
    cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&confidential_addr);
    cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
    return 0;
  }
  confidential_addr.unblinded_address_._0_8_ =
       (long)
       "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
       + 0x56;
  confidential_addr.unblinded_address_.witness_ver_ = 0x77;
  confidential_addr.unblinded_address_.address_._M_dataplus._M_p = "CfdParseConfidentialAddress";
  cfd::core::logger::warn<>
            ((CfdSourceLocation *)&confidential_addr,"confidential address is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&confidential_addr,
             "Failed to parameter. confidential address is null or empty.",(allocator *)&addr);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&confidential_addr);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdParseConfidentialAddress(
    void* handle, const char* confidential_address, char** address,
    char** confidential_key, int* network_type) {
  char* work_address = nullptr;
  char* work_confidential_key = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(confidential_address)) {
      warn(CFD_LOG_SOURCE, "confidential address is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential address is null or empty.");
    }

    ElementsAddressFactory factory;
    ElementsConfidentialAddress confidential_addr;
    confidential_addr = factory.GetConfidentialAddress(confidential_address);
    Address addr = confidential_addr.GetUnblindedAddress();
    if (network_type != nullptr) {
      // convert to c_network_type
      *network_type = ConvertFromCfdNetType(addr.GetNetType());
    }
    if (address != nullptr) {
      work_address = CreateString(addr.GetAddress());
    }
    if (confidential_key != nullptr) {
      work_confidential_key =
          CreateString(confidential_addr.GetConfidentialKey().GetHex());
    }

    if (work_address != nullptr) *address = work_address;
    if (work_confidential_key != nullptr)
      *confidential_key = work_confidential_key;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_address, &work_confidential_key);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_address, &work_confidential_key);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_address, &work_confidential_key);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}